

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O0

idx_t duckdb::UncompressedStringStorage::RemainingSpace(ColumnSegment *segment,BufferHandle *handle)

{
  StringDictionaryContainer this;
  __int_type _Var1;
  long lVar2;
  idx_t iVar3;
  ColumnSegment *in_RDI;
  idx_t used_space;
  StringDictionaryContainer dictionary;
  BufferHandle *in_stack_ffffffffffffffe0;
  ColumnSegment *in_stack_ffffffffffffffe8;
  
  this = GetDictionary(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  _Var1 = ::std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)this)
  ;
  lVar2 = ((ulong)this & 0xffffffff) + _Var1 * 4 + 8;
  iVar3 = ColumnSegment::SegmentSize(in_RDI);
  return iVar3 - lVar2;
}

Assistant:

idx_t UncompressedStringStorage::RemainingSpace(ColumnSegment &segment, BufferHandle &handle) {
	auto dictionary = GetDictionary(segment, handle);
	D_ASSERT(dictionary.end == segment.SegmentSize());
	idx_t used_space = dictionary.size + segment.count * sizeof(int32_t) + DICTIONARY_HEADER_SIZE;
	D_ASSERT(segment.SegmentSize() >= used_space);
	return segment.SegmentSize() - used_space;
}